

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# predictor_enc.c
# Opt level: O2

float PredictionCostSpatial(int *counts,int weight_0,double exp_val)

{
  int *piVar1;
  long lVar2;
  double dVar3;
  
  dVar3 = (double)(weight_0 * *counts);
  piVar1 = counts + 1;
  for (lVar2 = 0; lVar2 != -0xf; lVar2 = lVar2 + -1) {
    dVar3 = dVar3 + (double)(counts[lVar2 + 0xff] + *piVar1) * exp_val;
    exp_val = exp_val * 0.6;
    piVar1 = piVar1 + 1;
  }
  return (float)(dVar3 * -0.1);
}

Assistant:

static float PredictionCostSpatial(const int counts[256], int weight_0,
                                   double exp_val) {
  const int significant_symbols = 256 >> 4;
  const double exp_decay_factor = 0.6;
  double bits = weight_0 * counts[0];
  int i;
  for (i = 1; i < significant_symbols; ++i) {
    bits += exp_val * (counts[i] + counts[256 - i]);
    exp_val *= exp_decay_factor;
  }
  return (float)(-0.1 * bits);
}